

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3ValueText(sqlite3_value *pVal,u8 enc)

{
  u8 enc_local;
  sqlite3_value *pVal_local;
  
  if (pVal == (sqlite3_value *)0x0) {
    pVal_local = (sqlite3_value *)0x0;
  }
  else if (((pVal->flags & 0x202) == 0x202) && (pVal->enc == enc)) {
    pVal_local = (sqlite3_value *)pVal->z;
  }
  else if ((pVal->flags & 1) == 0) {
    pVal_local = (sqlite3_value *)valueToText(pVal,enc);
  }
  else {
    pVal_local = (sqlite3_value *)0x0;
  }
  return pVal_local;
}

Assistant:

SQLITE_PRIVATE const void *sqlite3ValueText(sqlite3_value* pVal, u8 enc){
  if( !pVal ) return 0;
  assert( pVal->db==0 || sqlite3_mutex_held(pVal->db->mutex) );
  assert( (enc&3)==(enc&~SQLITE_UTF16_ALIGNED) );
  assert( (pVal->flags & MEM_RowSet)==0 );
  if( (pVal->flags&(MEM_Str|MEM_Term))==(MEM_Str|MEM_Term) && pVal->enc==enc ){
    return pVal->z;
  }
  if( pVal->flags&MEM_Null ){
    return 0;
  }
  return valueToText(pVal, enc);
}